

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

string * __thiscall
helics::ActionMessage::packetize_json_abi_cxx11_(string *__return_storage_ptr__,ActionMessage *this)

{
  size_type sVar1;
  long lVar2;
  
  to_json_string_abi_cxx11_(__return_storage_ptr__,this);
  sVar1 = __return_storage_ptr__->_M_string_length;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
  _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,0,0,4,-0xd);
  lVar2 = sVar1 + 4;
  (__return_storage_ptr__->_M_dataplus)._M_p[1] = (char)((ulong)lVar2 >> 0x10);
  (__return_storage_ptr__->_M_dataplus)._M_p[2] = (char)((ulong)lVar2 >> 8);
  (__return_storage_ptr__->_M_dataplus)._M_p[3] = (char)lVar2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,-6);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,-4);
  return __return_storage_ptr__;
}

Assistant:

std::string ActionMessage::packetize_json() const
{
    std::string data = to_json_string();
    auto dsz = data.size() + sizeof(uint32_t);
    data.insert(data.begin(), 4, LEADING_CHAR);
    data[1] = static_cast<char>(((dsz >> 16U) & 0xFFU));
    data[2] = static_cast<char>(((dsz >> 8U) & 0xFFU));
    data[3] = static_cast<char>(dsz & 0xFFU);
    data.push_back(TAIL_CHAR1);
    data.push_back(TAIL_CHAR2);
    return data;
}